

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<double>_>::AddSub
          (TPZMatrix<std::complex<double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,
          int64_t colSize,int64_t pRow,int64_t pCol,TPZMatrix<std::complex<double>_> *pA)

{
  long lVar1;
  int64_t r;
  int64_t c;
  int64_t iVar2;
  int64_t col;
  int64_t iVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  double dVar4;
  long local_80;
  double local_48;
  double dStack_40;
  
  lVar1 = rowSize + pRow;
  local_80 = sRow;
  if (((pA->super_TPZBaseMatrix).fRow < lVar1) || ((pA->super_TPZBaseMatrix).fCol < colSize + pCol))
  {
    Error("AddSub <the sub-matrix is too big that target>",(char *)0x0);
  }
  while( true ) {
    iVar2 = pCol;
    iVar3 = sCol;
    if (lVar1 <= pRow) break;
    for (; iVar2 < colSize + pCol; iVar2 = iVar2 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,local_80,iVar3);
      dVar4 = in_XMM1_Qa;
      (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(pA,pRow,iVar2);
      local_48 = extraout_XMM0_Qa_00 + extraout_XMM0_Qa;
      dStack_40 = dVar4 + in_XMM1_Qa;
      (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(pA,pRow,iVar2,&local_48);
      iVar3 = iVar3 + 1;
      in_XMM1_Qa = dVar4;
    }
    pRow = pRow + 1;
    local_80 = local_80 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow, const int64_t sCol, const int64_t rowSize,
							const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        Error( "AddSub <the sub-matrix is too big that target>" );
    }
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col )+pA->GetVal(r,c));
        }
    }
    return( 1 );
}